

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecode.c
# Opt level: O1

int bc_append(lgx_compiler_t *c,uint i)

{
  uint uVar1;
  uint32_t *puVar2;
  
  uVar1 = (c->bc).size;
  if (uVar1 <= (c->bc).length) {
    uVar1 = uVar1 * 2;
    (c->bc).size = uVar1;
    puVar2 = (uint32_t *)realloc((c->bc).buffer,(ulong)uVar1 << 2);
    if (puVar2 == (uint32_t *)0x0) {
      return 1;
    }
    (c->bc).buffer = puVar2;
  }
  (c->bc).buffer[(c->bc).length] = i;
  (c->bc).length = (c->bc).length + 1;
  return 0;
}

Assistant:

static int bc_append(lgx_compiler_t* c, unsigned i) {
    if (c->bc.length >= c->bc.size) {
        c->bc.size *= 2;
        unsigned* buf = (unsigned *)xrealloc(c->bc.buffer, c->bc.size * sizeof(unsigned));
        if (!buf) {
            return 1;
        }
        c->bc.buffer = buf;
    }

    c->bc.buffer[c->bc.length] = i;
    c->bc.length ++;

    return 0;
}